

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall QOpenGLTexturePrivate::allocateImmutableStorage(QOpenGLTexturePrivate *this)

{
  GLsizei height;
  GLsizei GVar1;
  BindingTarget BVar2;
  GLenum target;
  Target target_00;
  GLuint GVar3;
  char *pcVar4;
  QOpenGLTextureHelper *pQVar5;
  int levels;
  TextureFormat TVar6;
  int height_00;
  int iVar7;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  target_00 = this->target;
  if (target_00 == Target1D) {
    if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
         super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2000) != 0) {
      QOpenGLTextureHelper::glTextureStorage1D
                (this->texFuncs,this->textureId,0xde0,this->bindingTarget,this->mipLevels,
                 this->format,this->dimensions[0]);
      goto LAB_00150771;
    }
    pcVar4 = "1D textures are not supported";
LAB_001508ec:
    local_20 = "default";
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    QMessageLogger::warning(local_38,pcVar4);
  }
  else {
    if (target_00 == Target2D) {
LAB_001505c8:
      pQVar5 = this->texFuncs;
      BVar2 = this->bindingTarget;
      GVar3 = this->textureId;
      iVar7 = this->mipLevels;
      TVar6 = this->format;
      GVar1 = this->dimensions[0];
      height = this->dimensions[1];
LAB_00150721:
      QOpenGLTextureHelper::glTextureStorage2D
                (pQVar5,GVar3,target_00,BVar2,iVar7,TVar6,GVar1,height);
    }
    else {
      if (target_00 == Target3D) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x10) != 0) {
          pQVar5 = this->texFuncs;
          BVar2 = this->bindingTarget;
          GVar3 = this->textureId;
          levels = this->mipLevels;
          TVar6 = this->format;
          GVar1 = this->dimensions[0];
          height_00 = this->dimensions[1];
          iVar7 = this->dimensions[2];
          target = 0x806f;
          goto LAB_00150763;
        }
        pcVar4 = "3D textures are not supported";
        goto LAB_001508ec;
      }
      if ((target_00 == TargetRectangle) || (target_00 == TargetCubeMap)) goto LAB_001505c8;
      if (target_00 == Target1DArray) {
        if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
              super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x2008) != 0) {
          pcVar4 = "1D array textures are not supported";
          goto LAB_001508ec;
        }
        pQVar5 = this->texFuncs;
        BVar2 = this->bindingTarget;
        GVar3 = this->textureId;
        iVar7 = this->mipLevels;
        TVar6 = this->format;
        GVar1 = this->dimensions[0];
        height = this->layers;
        target_00 = Target1DArray;
        goto LAB_00150721;
      }
      if (target_00 == Target2DArray) {
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 8) == 0) {
          pcVar4 = "Array textures are not supported";
          goto LAB_001508ec;
        }
        pQVar5 = this->texFuncs;
        BVar2 = this->bindingTarget;
        GVar3 = this->textureId;
        levels = this->mipLevels;
        TVar6 = this->format;
        GVar1 = this->dimensions[0];
        height_00 = this->dimensions[1];
        iVar7 = this->layers;
        target = 0x8c1a;
      }
      else {
        if (target_00 != TargetCubeMapArray) {
          if (target_00 == Target2DMultisample) {
            if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
                 super_QFlagsStorage<QOpenGLTexture::Feature>.i & 2) == 0) {
              pcVar4 = "Multisample textures are not supported";
              goto LAB_001508ec;
            }
            QOpenGLTextureHelper::glTextureStorage2DMultisample
                      (this->texFuncs,this->textureId,0x9100,this->bindingTarget,this->samples,
                       this->format,this->dimensions[0],this->dimensions[1],
                       this->fixedSamplePositions);
          }
          else if (target_00 == Target2DMultisampleArray) {
            if ((~(this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
                  super_QFlagsStorage<QOpenGLTexture::Feature>.i & 10) != 0) {
              pcVar4 = "Multisample array textures are not supported";
              goto LAB_001508ec;
            }
            QOpenGLTextureHelper::glTextureStorage3DMultisample
                      (this->texFuncs,this->textureId,0x9102,this->bindingTarget,this->samples,
                       this->format,this->dimensions[0],this->dimensions[1],this->layers,
                       this->fixedSamplePositions);
          }
          else if (target_00 == TargetBuffer) {
            pcVar4 = "Buffer textures do not allocate storage";
            goto LAB_001508ec;
          }
          goto LAB_00150771;
        }
        if (((this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
             super_QFlagsStorage<QOpenGLTexture::Feature>.i & 0x80) == 0) {
          pcVar4 = "Cubemap Array textures are not supported";
          goto LAB_001508ec;
        }
        pQVar5 = this->texFuncs;
        BVar2 = this->bindingTarget;
        GVar3 = this->textureId;
        levels = this->mipLevels;
        TVar6 = this->format;
        GVar1 = this->dimensions[0];
        height_00 = this->dimensions[1];
        iVar7 = this->layers * 6;
        target = 0x9009;
      }
LAB_00150763:
      QOpenGLTextureHelper::glTextureStorage3D
                (pQVar5,GVar3,target,BVar2,levels,TVar6,GVar1,height_00,iVar7);
    }
LAB_00150771:
    this->storageAllocated = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTexturePrivate::allocateImmutableStorage()
{
    switch (target) {
    case QOpenGLTexture::TargetBuffer:
        // Buffer textures get their storage from an external OpenGL buffer
        qWarning("Buffer textures do not allocate storage");
        return;

    case QOpenGLTexture::Target1D:
        if (features.testFlag(QOpenGLTexture::Texture1D)) {
            texFuncs->glTextureStorage1D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0]);
        } else {
            qWarning("1D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target1DArray:
        if (features.testFlag(QOpenGLTexture::Texture1D)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], layers);
        } else {
            qWarning("1D array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetRectangle:
        texFuncs->glTextureStorage2D(textureId, target, bindingTarget, mipLevels, format,
                                     dimensions[0], dimensions[1]);
        break;

    case QOpenGLTexture::Target2DArray:
        if (features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], layers);
        } else {
            qWarning("Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::TargetCubeMapArray:
        // Cubemap arrays must specify number of layer-faces (6 * layers) as depth parameter
        if (features.testFlag(QOpenGLTexture::TextureCubeMapArrays)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], 6 * layers);
        } else {
            qWarning("Cubemap Array textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target3D:
        if (features.testFlag(QOpenGLTexture::Texture3D)) {
            texFuncs->glTextureStorage3D(textureId, target, bindingTarget, mipLevels, format,
                                         dimensions[0], dimensions[1], dimensions[2]);
        } else {
            qWarning("3D textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisample:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)) {
            texFuncs->glTextureStorage2DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1],
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample textures are not supported");
            return;
        }
        break;

    case QOpenGLTexture::Target2DMultisampleArray:
        if (features.testFlag(QOpenGLTexture::ImmutableMultisampleStorage)
                && features.testFlag(QOpenGLTexture::TextureArrays)) {
            texFuncs->glTextureStorage3DMultisample(textureId, target, bindingTarget, samples, format,
                                                    dimensions[0], dimensions[1], layers,
                                                    fixedSamplePositions);
        } else {
            qWarning("Multisample array textures are not supported");
            return;
        }
        break;
    }

    storageAllocated = true;
}